

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O1

void Image_Function::ConvertTo8Bit
               (Image16Bit *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  imageException *this;
  unsigned_short *puVar4;
  uchar *puVar5;
  ulong uVar6;
  uchar *puVar7;
  ulong uVar8;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_short>>
            (in,startXIn,startYIn,width,height);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (out,startXOut,startYOut,width,height);
  bVar1 = in->_colorCount;
  if (bVar1 == out->_colorCount) {
    uVar2 = out->_rowSize;
    if (height * uVar2 != 0) {
      puVar5 = out->_data + (ulong)(startXOut * bVar1) + (ulong)(startYOut * uVar2);
      puVar7 = puVar5 + height * uVar2;
      uVar8 = (ulong)(width * bVar1);
      uVar3 = in->_rowSize;
      puVar4 = in->_data + (ulong)(startYIn * uVar3) + (ulong)startXIn;
      do {
        if (uVar8 != 0) {
          uVar6 = 0;
          do {
            puVar5[uVar6] = *(uchar *)((long)puVar4 + uVar6 * 2 + 1);
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        puVar5 = puVar5 + uVar2;
        puVar4 = puVar4 + uVar3;
      } while (puVar5 != puVar7);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Color counts of images are different");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void ConvertTo8Bit( const Image16Bit & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                        uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, width, height );
        ParameterValidation( out, startXOut, startYOut, width, height );
        if ( in.colorCount() != out.colorCount() )
            throw imageException( "Color counts of images are different" );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t colorCount = in.colorCount();

        const uint16_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t      * outY = out.data() + startYOut * rowSizeOut + startXOut * colorCount;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        width = width * colorCount;

        for ( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint16_t * inX  = inY;
            uint8_t        * outX = outY;
            const uint8_t  * outXEnd = outX + width;

            for ( ; outX != outXEnd; ++outX, ++inX )
                *outX = (*inX) >> 8;
        }
    }